

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O3

void __thiscall
commoditizedUnits_basic_Test::~commoditizedUnits_basic_Test(commoditizedUnits_basic_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(commoditizedUnits, basic)
{
    auto commu = unit_from_string("meter{cloth}");
    EXPECT_EQ(getCommodityName(commu.commodity()), "cloth");

    auto commu2 = unit_from_string("meter{Cloth}");
    EXPECT_EQ(getCommodityName(commu2.commodity()), "cloth");

    auto commu3 = unit_from_string("meter{CLOTH}");
    EXPECT_EQ(getCommodityName(commu3.commodity()), "cloth");

    auto commu4 = unit_from_string("meter of cloth");
    EXPECT_EQ(getCommodityName(commu4.commodity()), "cloth");

    EXPECT_EQ(commu4, commu);

    auto commu5 = unit_from_string("metre{CLOTH}");
    EXPECT_EQ(getCommodityName(commu5.commodity()), "cloth");

    auto commu6 = unit_from_string("metre of cloth");
    EXPECT_EQ(getCommodityName(commu6.commodity()), "cloth");

    EXPECT_EQ(commu6, commu);
}